

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRocket_dns.c
# Opt level: O0

void PrintFinalStats(void *cvode_mem)

{
  int iVar1;
  undefined8 in_RDI;
  int retval;
  long nge;
  long netf;
  long ncfn;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfe;
  long nst;
  char *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  iVar1 = CVodeGetNumSteps(in_RDI,&local_10);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,iVar1);
  iVar1 = CVodeGetNumRhsEvals(local_8,&local_18);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,iVar1);
  iVar1 = CVodeGetNumLinSolvSetups(local_8,&local_20);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,iVar1);
  iVar1 = CVodeGetNumErrTestFails(local_8,&stack0xffffffffffffffb8);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,iVar1);
  iVar1 = CVodeGetNumNonlinSolvIters(local_8,&local_38);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,iVar1);
  iVar1 = CVodeGetNumNonlinSolvConvFails(local_8,&local_40);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,iVar1);
  iVar1 = CVodeGetNumJacEvals(local_8,&local_28);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,iVar1);
  iVar1 = CVodeGetNumLinRhsEvals(local_8,&local_30);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,iVar1);
  iVar1 = CVodeGetNumGEvals(local_8,&stack0xffffffffffffffb0);
  check_retval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,iVar1);
  printf("\nFinal Statistics:\n");
  printf("nst = %-6ld nfe  = %-6ld nsetups = %-6ld nfeLS = %-6ld nje = % ld\n",local_10,local_18,
         local_20,local_30,local_28);
  printf("nni = %-6ld ncfn = %-6ld netf = %-6ld nge = %ld\n \n",local_38,local_40,
         in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  return;
}

Assistant:

static void PrintFinalStats(void* cvode_mem)
{
  long int nst, nfe, nsetups, nje, nfeLS, nni, ncfn, netf, nge;
  int retval;

  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);

  retval = CVodeGetNumJacEvals(cvode_mem, &nje);
  check_retval(&retval, "CVodeGetNumJacEvals", 1);
  retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  check_retval(&retval, "CVodeGetNumLinRhsEvals", 1);

  retval = CVodeGetNumGEvals(cvode_mem, &nge);
  check_retval(&retval, "CVodeGetNumGEvals", 1);

  printf("\nFinal Statistics:\n");
  printf("nst = %-6ld nfe  = %-6ld nsetups = %-6ld nfeLS = %-6ld nje = % ld\n",
         nst, nfe, nsetups, nfeLS, nje);
  printf("nni = %-6ld ncfn = %-6ld netf = %-6ld nge = %ld\n \n", nni, ncfn,
         netf, nge);
}